

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::sampleNearest2D
          (tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,float v,IVec3 *offset)

{
  uint uVar1;
  TextureChannelClass TVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint j;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 in_register_00001244 [12];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vec4 VVar15;
  Vec4 VVar16;
  TextureFormat local_48;
  uint uStack_40;
  uint uStack_3c;
  undefined1 auVar17 [12];
  undefined8 uVar18;
  Vector<float,_4> VVar14;
  
  auVar12._4_12_ = in_register_00001244;
  auVar12._0_4_ = v;
  auVar13._0_8_ = auVar12._0_8_;
  uVar4 = (access->m_size).m_data[0];
  uVar1 = (access->m_size).m_data[1];
  fVar8 = floorf(u);
  uVar5 = (int)fVar8 + offset->m_data[0];
  fVar8 = floorf(v);
  uVar7 = (int)fVar8 + offset->m_data[1];
  if (((sampler->wrapS != CLAMP_TO_BORDER) || ((int)uVar5 < (int)uVar4 && -1 < (int)uVar5)) &&
     ((sampler->wrapT != CLAMP_TO_BORDER || (-1 < (int)uVar7 && (int)uVar7 < (int)uVar1)))) {
    uVar6 = uVar5;
    j = 0;
    switch(sampler->wrapS) {
    case CLAMP_TO_EDGE:
    case MIRRORED_REPEAT_CL:
      uVar6 = uVar4 - 1;
      if ((int)uVar5 < (int)(uVar4 - 1)) {
        uVar6 = uVar5;
      }
      j = 0;
      if (-1 < (int)uVar5) {
        j = uVar6;
      }
      break;
    case CLAMP_TO_BORDER:
      if ((int)uVar5 < (int)uVar4) {
        uVar4 = uVar5;
      }
      j = 0xffffffff;
      if (-2 < (int)uVar5) {
        j = uVar4;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      j = ((int)uVar5 % (int)uVar4 >> 0x1f & uVar4) + (int)uVar5 % (int)uVar4;
      break;
    case MIRRORED_ONCE:
      uVar6 = uVar4;
      if ((int)uVar5 < (int)uVar4) {
        uVar6 = uVar5;
      }
      if (SBORROW4(uVar5,-uVar4) != (int)(uVar5 + uVar4) < 0) {
        uVar6 = -uVar4;
      }
    case MIRRORED_REPEAT_GL:
      iVar3 = (int)uVar6 % (int)(uVar4 * 2);
      uVar5 = (iVar3 - uVar4) + (iVar3 >> 0x1f & uVar4 * 2);
      j = ~((int)uVar5 >> 0x1f ^ uVar5) + uVar4;
    }
    uVar4 = uVar7;
    uVar5 = 0;
    switch(sampler->wrapT) {
    case CLAMP_TO_EDGE:
    case MIRRORED_REPEAT_CL:
      uVar4 = uVar1 - 1;
      if ((int)uVar7 < (int)(uVar1 - 1)) {
        uVar4 = uVar7;
      }
      uVar5 = 0;
      if (-1 < (int)uVar7) {
        uVar5 = uVar4;
      }
      break;
    case CLAMP_TO_BORDER:
      if ((int)uVar7 < (int)uVar1) {
        uVar1 = uVar7;
      }
      uVar5 = 0xffffffff;
      if (-2 < (int)uVar7) {
        uVar5 = uVar1;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      uVar5 = ((int)uVar7 % (int)uVar1 >> 0x1f & uVar1) + (int)uVar7 % (int)uVar1;
      break;
    case MIRRORED_ONCE:
      uVar4 = uVar1;
      if ((int)uVar7 < (int)uVar1) {
        uVar4 = uVar7;
      }
      if (SBORROW4(uVar7,-uVar1) != (int)(uVar7 + uVar1) < 0) {
        uVar4 = -uVar1;
      }
    case MIRRORED_REPEAT_GL:
      iVar3 = (int)uVar4 % (int)(uVar1 * 2);
      uVar4 = (iVar3 - uVar1) + (iVar3 >> 0x1f & uVar1 * 2);
      uVar5 = ~((int)uVar4 >> 0x1f ^ uVar4) + uVar1;
    }
    VVar16 = lookup((ConstPixelBufferAccess *)this,(int)access,j,uVar5);
    return (Vec4)VVar16.m_data;
  }
  TVar2 = getTextureChannelClass((access->m_format).type);
  switch(TVar2) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    VVar14 = sampleTextureBorder<float>((TextureFormat *)this,(Sampler *)access);
    VVar15.m_data[0] = VVar14.m_data[0];
    auVar17._4_4_ = VVar14.m_data[1];
    register0x00001240 = VVar14.m_data[2];
    register0x00001244 = VVar14.m_data[3];
    return (Vec4)VVar15.m_data;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    sampleTextureBorder<int>(&local_48,(Sampler *)access);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    fVar8 = (float)(int)local_48.order;
    fVar9 = (float)(int)local_48.type;
    fVar10 = (float)(int)uStack_40;
    fVar11 = (float)(int)uStack_3c;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    sampleTextureBorder<unsigned_int>(&local_48,(Sampler *)access);
    fVar8 = 0.0;
    fVar9 = 0.0;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    auVar13._0_8_ =
         CONCAT44(((float)(local_48.type >> 0x10 | 0x53000000) - 5.497642e+11) +
                  (float)(local_48.type & 0xffff | 0x4b000000),
                  ((float)(local_48.order >> 0x10 | 0x53000000) - 5.497642e+11) +
                  (float)(local_48.order & 0xffff | 0x4b000000));
    auVar13._8_4_ =
         ((float)(uStack_40 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_40 & 0xffff | 0x4b000000);
    auVar13._12_4_ =
         ((float)(uStack_3c >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_3c & 0xffff | 0x4b000000);
    *(undefined1 (*) [16])this = auVar13;
    goto LAB_00a351ce;
  default:
    fVar8 = -1.0;
    fVar9 = -1.0;
    fVar10 = -1.0;
    fVar11 = -1.0;
  }
  *(float *)this = fVar8;
  *(float *)(this + 4) = fVar9;
  *(float *)(this + 8) = fVar10;
  *(float *)(this + 0xc) = fVar11;
LAB_00a351ce:
  VVar16.m_data[1] = fVar9;
  VVar16.m_data[0] = fVar8;
  VVar16.m_data[2] = (float)(int)auVar13._0_8_;
  VVar16.m_data[3] = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
  return (Vec4)VVar16.m_data;
}

Assistant:

static Vec4 sampleNearest2D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, float v, const IVec3& offset)
{
	int width	= access.getWidth();
	int height	= access.getHeight();

	int x = deFloorFloatToInt32(u)+offset.x();
	int y = deFloorFloatToInt32(v)+offset.y();

	// Check for CLAMP_TO_BORDER.
	if ((sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width)) ||
		(sampler.wrapT == Sampler::CLAMP_TO_BORDER && !deInBounds32(y, 0, height)))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);
	int j = wrap(sampler.wrapT, y, height);

	return lookup(access, i, j, offset.z());
}